

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O3

void invert_U8(uchar *U,int n)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  if (1 < n) {
    uVar6 = (ulong)(n - 2);
    do {
      uVar8 = (uint)uVar6;
      if ((int)uVar8 < 1) {
        return;
      }
      uVar4 = ((uint)n >> 3) * uVar8;
      uVar9 = (ulong)(uVar8 + 1 >> 3);
      cVar7 = (char)(0x100 >> ((byte)(uVar8 + 1) & 7));
      uVar12 = uVar6;
      do {
        uVar1 = uVar12 - 1;
        iVar5 = (int)uVar1 * n;
        iVar10 = iVar5 + 7;
        if (-1 < iVar5) {
          iVar10 = iVar5;
        }
        bVar3 = -((U[(int)((iVar10 >> 3) + ((uint)(uVar6 >> 3) & 0x1fffffff))] >> (~uVar8 & 7) & 1)
                 != 0);
        lVar13 = uVar1 * ((uint)n >> 3);
        uVar11 = n - 1;
        if ((int)(uVar8 + 9) < n) {
          do {
            U[(ulong)(uVar11 >> 3) + lVar13] =
                 U[(ulong)(uVar11 >> 3) + lVar13] ^ U[(ulong)(uVar11 >> 3) + (ulong)uVar4] & bVar3;
            uVar11 = uVar11 - 8;
          } while ((int)(uVar8 + 9) <= (int)uVar11);
        }
        U[lVar13 + uVar9] =
             (bVar3 & U[uVar4 + uVar9] ^ U[lVar13 + uVar9]) & cVar7 - 1U |
             U[lVar13 + uVar9] & -cVar7;
        bVar2 = 1 < (long)uVar12;
        uVar12 = uVar1;
      } while (bVar2);
      uVar6 = uVar6 - 1;
    } while (0 < (int)uVar8);
  }
  return;
}

Assistant:

void invert_U8(unsigned char *U, int n)
{
  /*
   * inversion == backwards substitution
   *
   * For all columns c = n-1 ... 0
   *   For all rows c-1 ... 0
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = c+1 ... n-1
   */
  for(int c = n-2; c >= 0; c--)
  {
    /*
     * Basically:
     *      copy elements c+1 to n-1 from c'th row to r'th row iff leading element of row r is 1
     */

    for(int r = c-1; r >= 0; r--)
    {
      /*
       * first copy all "full bytes" at the right
       */
      unsigned char mask_rc = 0x00 - ((U[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = n-1; k >= c+1 + 8; k -= 8)
      {
        U[r*(n/8) + k/8] ^= mask_rc & U[c*(n/8) + k/8];
      }

      /*
       * then handle the left-most "partial byte"
       */
      int k = c+1;
      unsigned char mask_prepending = (unsigned char) (0x100 >> (k % 8)) - 1;

      unsigned char tmp_rk = U[r*(n/8) + k/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      U[r*(n/8) + k/8]  ^= (mask_rc & U[c*(n/8) + k/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      U[r*(n/8) + k/8] &= mask_prepending;
      U[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}